

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O2

void __thiscall
FBaseCVar::FBaseCVar(FBaseCVar *this,char *var_name,DWORD flags,_func_void_FBaseCVar_ptr *callback)

{
  FBaseCVar *pFVar1;
  char *pcVar2;
  UCVarValue value;
  ECVarType type;
  ECVarType local_2c;
  undefined4 extraout_var;
  
  this->_vptr_FBaseCVar = (_func_int **)&PTR__FBaseCVar_006ebe30;
  pFVar1 = FindCVar(var_name,(FBaseCVar **)0x0);
  this->m_Callback = callback;
  this->Flags = 0;
  this->Name = (char *)0x0;
  if (var_name != (char *)0x0) {
    C_AddTabCommand(var_name);
    pcVar2 = copystring(var_name);
    this->Name = pcVar2;
    this->m_Next = CVars;
    CVars = this;
  }
  if (pFVar1 == (FBaseCVar *)0x0) {
    flags = flags | 0x80;
  }
  else {
    value._0_4_ = (*pFVar1->_vptr_FBaseCVar[5])(pFVar1,&local_2c);
    value._4_4_ = extraout_var;
    ForceSet(this,value,local_2c,false);
    (**(code **)((long)pFVar1->_vptr_FBaseCVar + (ulong)(pFVar1->Flags >> 5 & 8)))(pFVar1);
  }
  this->Flags = flags;
  return;
}

Assistant:

FBaseCVar::FBaseCVar (const char *var_name, DWORD flags, void (*callback)(FBaseCVar &))
{
	FBaseCVar *var;

	var = FindCVar (var_name, NULL);

	m_Callback = callback;
	Flags = 0;
	Name = NULL;

	if (var_name)
	{
		C_AddTabCommand (var_name);
		Name = copystring (var_name);
		m_Next = CVars;
		CVars = this;
	}

	if (var)
	{
		ECVarType type;
		UCVarValue value;

		value = var->GetFavoriteRep (&type);
		ForceSet (value, type);

		if (var->Flags & CVAR_AUTO)
			delete var;
		else
			var->~FBaseCVar();

		Flags = flags;
	}
	else
	{
		Flags = flags | CVAR_ISDEFAULT;
	}
}